

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::write_utf8_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,string_view *sv)

{
  size_t sVar1;
  char *pcVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *__args;
  container_type *this_01;
  size_t sVar3;
  uint8_t buf [1];
  ulong val;
  uchar local_2f;
  uchar local_2e [3];
  uchar local_2b [3];
  
  val = sv->_M_len;
  if (val < 0x18) {
    val = (ulong)(byte)((byte)val | 0x60);
    this_01 = (this->sink_).buf_ptr;
    __args = local_2e;
  }
  else {
    if (0xff < val) {
      if (val < 0x10000) {
        local_2b[0] = 'y';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((this->sink_).buf_ptr,local_2b);
        binary::
        native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                  ((unsigned_short)val,
                   (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    )&this->sink_);
      }
      else {
        this_00 = (this->sink_).buf_ptr;
        if (val >> 0x20 == 0) {
          local_2b[1] = 0x7a;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,local_2b + 1);
          binary::
          native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    ((uint)val,
                     (back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      )&this->sink_);
        }
        else {
          local_2b[2] = 0x7b;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,local_2b + 2);
          binary::
          native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,jsoncons::detail::endian>
                    (val,(back_insert_iterator<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          )&this->sink_);
        }
      }
      goto LAB_0025ef54;
    }
    local_2e[1] = 0x78;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((this->sink_).buf_ptr,local_2e + 1);
    this_01 = (this->sink_).buf_ptr;
    __args = local_2e + 2;
  }
  *__args = (uchar)val;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_01,__args);
LAB_0025ef54:
  sVar1 = sv->_M_len;
  if (sVar1 != 0) {
    pcVar2 = sv->_M_str;
    sVar3 = 0;
    do {
      local_2f = pcVar2[sVar3];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((this->sink_).buf_ptr,&local_2f);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void write_utf8_string(const string_view& sv)
    {
        const size_t length = sv.size();

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x60 + length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x78), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x79), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x7a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x7b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                            std::back_inserter(sink_));
        }

        for (auto c : sv)
        {
            sink_.push_back(c);
        }
    }